

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall QPrintPreviewDialogPrivate::updateZoomFactor(QPrintPreviewDialogPrivate *this)

{
  QString *pQVar1;
  QPrintPreviewDialogPrivate *in_RSI;
  long in_FS_OFFSET;
  qreal qVar2;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QString *)QComboBox::lineEdit();
  qVar2 = QPrintPreviewWidget::zoomFactor((QPrintPreviewWidget *)this->preview);
  formattedZoomFactor((QString *)&local_30,in_RSI,qVar2 * 100.0);
  QLineEdit::setText(pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::updateZoomFactor()
{
    zoomFactor->lineEdit()->setText(formattedZoomFactor(preview->zoomFactor() * 100));
}